

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.cpp
# Opt level: O1

cl_int clMemFreeINTEL(cl_context context,void *ptr)

{
  _Rb_tree_header *p_Var1;
  atomic<unsigned_long> *paVar2;
  bool bVar3;
  _func_cl_int_cl_context_void_ptr *p_Var4;
  ulong enqueueCounter;
  CLIntercept *this;
  uint errorCode;
  cl_platform_id p_Var5;
  mapped_type *pmVar6;
  time_point end;
  _Base_ptr p_Var7;
  _Base_ptr p_Var8;
  time_point local_58;
  undefined1 local_50 [32];
  
  this = g_pIntercept;
  if (g_pIntercept == (CLIntercept *)0x0) {
    return -0x22;
  }
  p_Var5 = CLIntercept::getPlatform(g_pIntercept,context);
  p_Var1 = &(this->m_DispatchX)._M_t._M_impl.super__Rb_tree_header;
  p_Var8 = (this->m_DispatchX)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var7 = &p_Var1->_M_header;
  for (; p_Var8 != (_Base_ptr)0x0;
      p_Var8 = (&p_Var8->_M_left)[*(cl_platform_id *)(p_Var8 + 1) < p_Var5]) {
    if (*(cl_platform_id *)(p_Var8 + 1) >= p_Var5) {
      p_Var7 = p_Var8;
    }
  }
  p_Var8 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var7 != p_Var1) &&
     (p_Var8 = p_Var7, p_Var5 < *(cl_platform_id *)(p_Var7 + 1))) {
    p_Var8 = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)p_Var8 == p_Var1) {
    local_50._0_8_ = (key_type)0x0;
    pmVar6 = std::
             map<_cl_platform_id_*,_CLdispatchX,_std::less<_cl_platform_id_*>,_std::allocator<std::pair<_cl_platform_id_*const,_CLdispatchX>_>_>
             ::at(&this->m_DispatchX,(key_type *)local_50);
  }
  else {
    pmVar6 = (mapped_type *)&p_Var8[1]._M_parent;
  }
  p_Var4 = pmVar6->clMemFreeINTEL;
  if (p_Var4 == (_func_cl_int_cl_context_void_ptr *)0x0) goto LAB_0013aebe;
  enqueueCounter = (this->m_EnqueueCounter).super___atomic_base<unsigned_long>._M_i;
  if ((this->m_Config).CallLogging == true) {
    CLIntercept::callLoggingEnter
              (this,"clMemFreeINTEL",enqueueCounter,(cl_kernel)0x0,"context = %p, ptr = %p",context,
               ptr);
  }
  if (((this->m_Config).HostPerformanceTiming == false) &&
     ((this->m_Config).ChromeCallLogging != true)) {
    local_58.__d.__r = (duration)0;
  }
  else {
    local_58.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  }
  errorCode = (*pmVar6->clMemFreeINTEL)(context,ptr);
  pmVar6 = (mapped_type *)(ulong)errorCode;
  if (((this->m_Config).HostPerformanceTiming == false) &&
     ((this->m_Config).ChromeCallLogging != true)) {
    end.__d.__r = (duration)0;
  }
  else {
    end.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
    if (((this->m_Config).HostPerformanceTiming == true) &&
       (((this->m_Config).HostPerformanceTimingMinEnqueue <= enqueueCounter &&
        (enqueueCounter <= (this->m_Config).HostPerformanceTimingMaxEnqueue)))) {
      local_50._0_8_ = (key_type)(local_50 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"");
      CLIntercept::updateHostTimingStats(this,"clMemFreeINTEL",(string *)local_50,local_58,end);
      if ((key_type)local_50._0_8_ != (key_type)(local_50 + 0x10)) {
        operator_delete((void *)local_50._0_8_);
      }
    }
  }
  if ((ptr != (void *)0x0) &&
     (((((this->m_Config).DumpBuffersBeforeEnqueue != false ||
        ((this->m_Config).DumpBuffersAfterEnqueue != false)) ||
       ((this->m_Config).InjectBuffers != false)) ||
      (((this->m_Config).InjectImages != false || ((this->m_Config).CaptureReplay == true)))))) {
    CLIntercept::removeUSMAllocation(this,ptr);
  }
  bVar3 = (this->m_Config).ErrorLogging;
  if ((bVar3 == false) && ((this->m_Config).ErrorAssert == false)) {
    if ((errorCode != 0) && ((this->m_Config).NoErrors != false)) {
LAB_0013adfe:
      if (bVar3 != false) {
        CLIntercept::logError(this,"clMemFreeINTEL",errorCode);
      }
      if ((this->m_Config).ErrorAssert == true) {
        raise(5);
      }
      if ((this->m_Config).NoErrors != false) {
        pmVar6 = (mapped_type *)0x0;
      }
    }
  }
  else {
    if (errorCode != 0) goto LAB_0013adfe;
    pmVar6 = (mapped_type *)0x0;
  }
  if ((ptr != (void *)0x0) && ((this->m_Config).LeakChecking != false)) {
    LOCK();
    paVar2 = &(this->m_ObjectTracker).m_Pointers.NumFrees;
    (paVar2->super___atomic_base<unsigned_long>)._M_i =
         (paVar2->super___atomic_base<unsigned_long>)._M_i + 1;
    UNLOCK();
  }
  if ((this->m_Config).CallLogging == true) {
    CLIntercept::callLoggingExit
              (this,"clMemFreeINTEL",(cl_int)pmVar6,(cl_event *)0x0,(cl_sync_point_khr *)0x0);
  }
  if ((this->m_Config).ChromeCallLogging == true) {
    local_50._0_8_ = (key_type)(local_50 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"");
    CLIntercept::chromeCallLoggingExit
              (this,"clMemFreeINTEL",(string *)local_50,false,0,local_58,end);
    if ((key_type)local_50._0_8_ != (key_type)(local_50 + 0x10)) {
      operator_delete((void *)local_50._0_8_);
    }
  }
LAB_0013aebe:
  if (p_Var4 == (_func_cl_int_cl_context_void_ptr *)0x0) {
    return -0x22;
  }
  return (cl_int)pmVar6;
}

Assistant:

CL_API_ENTRY cl_int CL_API_CALL clMemFreeINTEL(
    cl_context context,
    void* ptr)
{
    CLIntercept*    pIntercept = GetIntercept();

    if( pIntercept )
    {
        const auto& dispatchX = pIntercept->dispatchX(context);
        if( dispatchX.clMemFreeINTEL )
        {
            GET_ENQUEUE_COUNTER();
            CALL_LOGGING_ENTER( "context = %p, ptr = %p",
                context,
                ptr );
            HOST_PERFORMANCE_TIMING_START();

            cl_int  retVal = dispatchX.clMemFreeINTEL(
                context,
                ptr );

            HOST_PERFORMANCE_TIMING_END();
            REMOVE_USM_ALLOCATION( ptr );
            CHECK_ERROR( retVal );
            ADD_POINTER_FREE( ptr );
            CALL_LOGGING_EXIT( retVal );

            return retVal;
        }
    }

    NULL_FUNCTION_POINTER_RETURN_ERROR(CL_INVALID_CONTEXT);
}